

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu.cpp
# Opt level: O0

blargg_err_t __thiscall Vgm_Emu::load_mem_(Vgm_Emu *this,byte_ *new_data,long new_size)

{
  blargg_ulong bVar1;
  blargg_err_t rate;
  long in_RDX;
  Classic_Emu *in_RSI;
  char **names;
  Music_Emu *in_RDI;
  blargg_err_t blargg_return_err__1;
  blargg_err_t blargg_return_err_;
  header_t *h;
  long in_stack_ffffffffffffffb8;
  char *pcVar2;
  Classic_Emu *this_00;
  char *local_8;
  
  if (in_RDX < 0x41) {
    local_8 = "Wrong file type for this emulator";
  }
  else {
    this_00 = in_RSI;
    rate = check_vgm_header((header_t *)in_RSI);
    local_8 = rate;
    if (rate == (blargg_err_t)0x0) {
      bVar1 = get_le32((byte *)((long)&(this_00->super_Music_Emu).super_Gme_File.type_ + 4));
      in_RDI[9].super_Gme_File.playlist.data.begin_ = (char *)(ulong)bVar1;
      if (in_RDI[9].super_Gme_File.playlist.data.begin_ == (char *)0x0) {
        in_RDI[9].super_Gme_File.playlist.data.begin_ = (char *)0x369e99;
      }
      Blip_Buffer::clock_rate((Blip_Buffer *)in_RDI,in_stack_ffffffffffffffb8);
      in_RDI[3].super_Gme_File.playlist.info_.engineer = (char *)in_RSI;
      in_RDI[3].super_Gme_File.playlist.info_.tagging =
           (in_RSI->super_Music_Emu).super_Gme_File.playlist_warning + in_RDX + -0x80;
      in_RDI[3].super_Gme_File.playlist.info_.ripping =
           in_RDI[3].super_Gme_File.playlist.info_.tagging;
      bVar1 = get_le32((byte *)((long)&(this_00->super_Music_Emu).super_Gme_File.warning_ + 4));
      if (bVar1 != 0) {
        pcVar2 = in_RDI[3].super_Gme_File.playlist.info_.engineer;
        bVar1 = get_le32((byte *)((long)&(this_00->super_Music_Emu).super_Gme_File.warning_ + 4));
        in_RDI[3].super_Gme_File.playlist.info_.ripping = pcVar2 + (ulong)bVar1 + 0x1c;
      }
      Music_Emu::set_voice_count(in_RDI,4);
      local_8 = setup_fm(this);
      if (local_8 == (blargg_err_t)0x0) {
        names = load_mem_::psg_names;
        if ((in_RDI[9].super_Gme_File.playlist.first_error_ & 0x100) != 0) {
          names = load_mem_::fm_names;
        }
        Music_Emu::set_voice_names(in_RDI,names);
        local_8 = Classic_Emu::setup_buffer(this_00,(long)rate);
      }
    }
  }
  return local_8;
}

Assistant:

blargg_err_t Vgm_Emu::load_mem_( byte const* new_data, long new_size )
{
	assert( offsetof (header_t,unused2 [8]) == header_size );
	
	if ( new_size <= header_size )
		return gme_wrong_file_type;
	
	header_t const& h = *(header_t const*) new_data;
	
	RETURN_ERR( check_vgm_header( h ) );
	
	check( get_le32( h.version ) <= 0x150 );
	
	// psg rate
	psg_rate = get_le32( h.psg_rate );
	if ( !psg_rate )
		psg_rate = 3579545;
	blip_buf.clock_rate( psg_rate );
	
	data     = new_data;
	data_end = new_data + new_size;
	
	// get loop
	loop_begin = data_end;
	if ( get_le32( h.loop_offset ) )
		loop_begin = &data [get_le32( h.loop_offset ) + offsetof (header_t,loop_offset)];
	
	set_voice_count( psg.osc_count );
	
	RETURN_ERR( setup_fm() );
	
	static const char* const fm_names [] = {
		"FM 1", "FM 2", "FM 3", "FM 4", "FM 5", "FM 6", "PCM", "PSG"
	};
	static const char* const psg_names [] = { "Square 1", "Square 2", "Square 3", "Noise" };
	set_voice_names( uses_fm ? fm_names : psg_names );
	
	// do after FM in case output buffer is changed
	return Classic_Emu::setup_buffer( psg_rate );
}